

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O3

void __thiscall QIconTheme::QIconTheme(QIconTheme *this,QString *themeName)

{
  int *piVar1;
  QDebug this_00;
  Data *pDVar2;
  qsizetype qVar3;
  char cVar4;
  bool bVar5;
  Context CVar6;
  short sVar7;
  undefined2 uVar8;
  int iVar9;
  undefined4 *puVar10;
  Type TVar11;
  long lVar12;
  QString *pQVar13;
  char *pcVar14;
  QString *key;
  undefined1 *puVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QLatin1String QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QAnyStringView QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QFileInfo themeDirInfo;
  QDir iconDir;
  QSharedPointer<QIconCacheGtkReader> result;
  QAnyStringView local_1e8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1d8 [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1c8 [2];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_1b8 [2];
  wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> local_1a8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_188 [2];
  QStringBuilder<QString_&,_QLatin1String> local_178;
  QAnyStringView local_158;
  QDebug local_148;
  storage_type_conflict *psStack_140;
  undefined1 *local_138;
  QString local_128;
  QArrayDataPointer<QString> local_108;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  QArrayDataPointer<QString> local_d8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<QString> local_88;
  undefined1 local_68 [26];
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  undefined8 uStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_gtkCaches).d.d = (Data *)0x0;
  (this->m_gtkCaches).d.ptr = (QSharedPointer<QIconCacheGtkReader> *)0x0;
  (this->m_gtkCaches).d.size = 0;
  (this->m_contentDirs).d.d = (Data *)0x0;
  (this->m_contentDirs).d.ptr = (QString *)0x0;
  (this->m_contentDirs).d.size = 0;
  (this->m_keyList).d.d = (Data *)0x0;
  (this->m_keyList).d.ptr = (QIconDirInfo *)0x0;
  (this->m_keyList).d.size = 0;
  (this->m_parents).d.d = (Data *)0x0;
  (this->m_parents).d.ptr = (QString *)0x0;
  *(undefined8 *)((long)&(this->m_parents).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this->m_parents).d.size + 1) = 0;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_b8);
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::themeSearchPaths();
  if ((undefined1 *)local_d8.size != (undefined1 *)0x0) {
    lVar12 = 0;
    puVar15 = (undefined1 *)0x0;
    do {
      local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QDir::QDir((QDir *)&local_108,(QString *)((long)&((local_d8.ptr)->d).d + lVar12));
      local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QDir::path();
      qVar3 = local_88.size;
      pQVar13 = local_88.ptr;
      pDVar2 = local_88.d;
      local_88.size = 0;
      local_88.d = (Data *)0x0;
      local_88.ptr = (QString *)0x0;
      local_68._0_4_ = SUB84(pDVar2,0);
      local_68._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
      local_68._8_4_ = SUB84(pQVar13,0);
      local_68._12_4_ = (undefined4)((ulong)pQVar13 >> 0x20);
      local_68._16_4_ = (undefined4)qVar3;
      local_68._20_4_ = (undefined4)((ulong)qVar3 >> 0x20);
      stack0xffffffffffffffb0 = (char *)CONCAT62(_sStack_4e,0x2f);
      uStack_48 = themeName;
      QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&>::convertTo<QString>
                ((QString *)&local_a8,
                 (QStringBuilder<QStringBuilder<QString,_char16_t>,_const_QString_&> *)local_68);
      piVar1 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
        }
      }
      if ((QArrayDataPointer<QString> *)local_88.d != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        *(int *)&(local_88.d)->super_QArrayData = *(int *)&(local_88.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_88.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
        }
      }
      local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_128,(QString *)&local_a8);
      cVar4 = QFileInfo::isDir();
      if (cVar4 != '\0') {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)this,(this->m_contentDirs).d.size,
                   (QString *)&local_a8);
        QList<QString>::end(&this->m_contentDirs);
        puVar10 = (undefined4 *)operator_new(0x38);
        *(code **)(puVar10 + 2) =
             QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::noDeleter;
        puVar10[1] = 1;
        *puVar10 = 1;
        local_68._8_4_ = SUB84(puVar10,0);
        local_68._12_4_ = (undefined4)((ulong)puVar10 >> 0x20);
        QIconCacheGtkReader::QIconCacheGtkReader
                  ((QIconCacheGtkReader *)(puVar10 + 4),(QString *)&local_a8);
        *(code **)(puVar10 + 2) =
             QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::deleter;
        local_68._0_8_ = (QIconCacheGtkReader *)(puVar10 + 4);
        QtPrivate::QMovableArrayOps<QSharedPointer<QIconCacheGtkReader>>::
        emplace<QSharedPointer<QIconCacheGtkReader>>
                  ((QMovableArrayOps<QSharedPointer<QIconCacheGtkReader>> *)&this->m_gtkCaches,
                   (this->m_gtkCaches).d.size,(QSharedPointer<QIconCacheGtkReader> *)local_68);
        QList<QSharedPointer<QIconCacheGtkReader>_>::end(&this->m_gtkCaches);
        QSharedPointer<QIconCacheGtkReader>::deref((Data *)CONCAT44(local_68._12_4_,local_68._8_4_))
        ;
      }
      if (this->m_valid == false) {
        local_88.d = (Data *)&local_a8;
        local_88.ptr = (QString *)&DAT_0000000c;
        local_88.size = 0x675a68;
        QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                  ((QString *)local_68,(QStringBuilder<QString_&,_QLatin1String> *)&local_88);
        QFile::setFileName((QString *)&local_b8);
        if ((QIconCacheGtkReader *)local_68._0_8_ != (QIconCacheGtkReader *)0x0) {
          LOCK();
          *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
          UNLOCK();
          if (*(int *)local_68._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
          }
        }
        bVar5 = (bool)QFile::exists();
        this->m_valid = bVar5;
        lcIconLoader();
        if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
           ) {
          local_68._0_4_ = 2;
          local_68._4_4_ = 0;
          local_68._8_4_ = 0;
          local_68._12_4_ = 0;
          local_68._16_4_ = 0;
          local_68._20_4_ = 0;
          stack0xffffffffffffffb0 = lcIconLoader::category.name;
          QMessageLogger::debug();
          this_00.stream = local_148.stream;
          QVar16.m_data = (storage_type *)0x15;
          QVar16.m_size = (qsizetype)&local_88;
          QString::fromUtf8(QVar16);
          QTextStream::operator<<(&(this_00.stream)->ts,(QString *)&local_88);
          pDVar2 = local_88.d;
          if ((QArrayDataPointer<QString> *)local_88.d != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            *(int *)&(local_88.d)->super_QArrayData = *(int *)&(local_88.d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&pDVar2->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
            }
          }
          if ((local_148.stream)->space == true) {
            QTextStream::operator<<(&(local_148.stream)->ts,' ');
          }
          QFile::fileName();
          pQVar13 = local_88.ptr;
          if (local_88.ptr == (QString *)0x0) {
            pQVar13 = (QString *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_148,(ulong)pQVar13);
          if ((local_148.stream)->space == true) {
            QTextStream::operator<<(&(local_148.stream)->ts,' ');
          }
          pcVar14 = "false";
          if (this->m_valid != false) {
            pcVar14 = "true";
          }
          QTextStream::operator<<(&(local_148.stream)->ts,pcVar14);
          if ((local_148.stream)->space == true) {
            QTextStream::operator<<(&(local_148.stream)->ts,' ');
          }
          pDVar2 = local_88.d;
          if ((QArrayDataPointer<QString> *)local_88.d != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            *(int *)&(local_88.d)->super_QArrayData = *(int *)&(local_88.d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&pDVar2->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
            }
          }
          QDebug::~QDebug(&local_148);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_128);
      if (&(local_a8.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d)->super_QArrayData,2,0x10);
        }
      }
      QDir::~QDir((QDir *)&local_108);
      puVar15 = puVar15 + 1;
      lVar12 = lVar12 + 0x18;
    } while (puVar15 < (ulong)local_d8.size);
  }
  if (this->m_valid != false) {
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    QFile::fileName();
    QSettings::QSettings((QSettings *)&local_e8,(QString *)local_68,IniFormat,(QObject *)0x0);
    if ((QIconCacheGtkReader *)local_68._0_8_ != (QIconCacheGtkReader *)0x0) {
      LOCK();
      *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QSettings::allKeys();
    if ((undefined1 *)local_108.size != (undefined1 *)0x0) {
      lVar12 = local_108.size * 0x18;
      pQVar13 = local_108.ptr;
      do {
        QVar17.m_data = &DAT_00000005;
        QVar17.m_size = (qsizetype)pQVar13;
        cVar4 = QString::endsWith(QVar17,0x675a8b);
        if (cVar4 != '\0') {
          QVar18.m_size = (size_t)&local_e8;
          QVar18.field_0.m_data_utf8 = local_68;
          QSettings::value(QVar18);
          iVar9 = ::QVariant::toInt((bool *)local_68);
          ::QVariant::~QVariant((QVariant *)local_68);
          if (iVar9 != 0) {
            local_128.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::left(&local_128,pQVar13,(pQVar13->d).size + -5);
            local_68._0_4_ = SUB84(local_128.d.d,0);
            local_68._4_4_ = (undefined4)((ulong)local_128.d.d >> 0x20);
            local_68._8_4_ = SUB84(local_128.d.ptr,0);
            local_68._12_4_ = (undefined4)((ulong)local_128.d.ptr >> 0x20);
            local_68._16_4_ = (undefined4)local_128.d.size;
            local_68._20_4_ = (undefined4)((ulong)local_128.d.size >> 0x20);
            if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            uStack_48 = (QString *)0xaaaaaaaa00020001;
            stack0xffffffffffffffb0 = (char *)(ulong)(ushort)iVar9;
            local_138 = &DAT_aaaaaaaaaaaaaaaa;
            local_148.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
            psStack_140 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d = (Data *)&local_128;
            local_a8.ptr = (QString *)&DAT_00000005;
            local_a8.size = 0x675a91;
            local_178.b.m_data = (char *)0x0;
            local_178.a = (QString *)0x0;
            local_178.b.m_size = 0;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      (&local_158,(QStringBuilder<QString_&,_QLatin1String> *)&local_a8,
                       (wrapped_t<QStringBuilder<QString_&,_QLatin1String>,_QString> *)&local_178);
            QVar19.m_size = (size_t)&local_e8;
            QVar19.field_0.m_data = &local_88;
            QSettings::value(QVar19);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_88);
            if ((QArrayData *)local_178.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_178.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_178.a)->d)->_q_value).super___atomic_base<int>._M_i
                   + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_178.a)->d)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_178.a,2,0x10);
              }
            }
            if (local_138 == (undefined1 *)0x8) {
              QVar21.m_data = psStack_140;
              QVar21.m_size = 8;
              QVar31.m_data = "Scalable";
              QVar31.m_size = 8;
              cVar4 = QtPrivate::equalStrings(QVar21,QVar31);
              TVar11 = Scalable;
              if (cVar4 == '\0') goto LAB_00278f26;
            }
            else {
              if (local_138 == (undefined1 *)0x5) {
                QVar20.m_data = psStack_140;
                QVar20.m_size = 5;
                QVar30.m_data = "Fixed";
                QVar30.m_size = 5;
                cVar4 = QtPrivate::equalStrings(QVar20,QVar30);
                if (cVar4 != '\0') {
                  TVar11 = Fixed;
                  goto LAB_00278f28;
                }
              }
LAB_00278f26:
              TVar11 = Threshold;
            }
LAB_00278f28:
            uStack_48._0_3_ = CONCAT12(TVar11,(short)uStack_48);
            local_178.a = &local_128;
            local_178.b.m_size = 10;
            local_178.b.m_data = "/Threshold";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      ((QAnyStringView *)local_188,&local_178,&local_1a8);
            ::QVariant::QVariant((QVariant *)&local_a8,2);
            QVar22.m_size = (size_t)&local_e8;
            QVar22.field_0.m_data_utf8 = (char *)&local_88;
            QSettings::value(QVar22,(QVariant *)local_188[0].m_data);
            sVar7 = ::QVariant::toInt((bool *)&local_88);
            sStack_4a = sVar7;
            ::QVariant::~QVariant((QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)&local_a8);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_178.a = &local_128;
            local_178.b.m_size = (qsizetype)&DAT_00000008;
            local_178.b.m_data = "/MinSize";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      ((QAnyStringView *)local_1b8,&local_178,&local_1a8);
            ::QVariant::QVariant((QVariant *)&local_a8,iVar9);
            QVar23.m_size = (size_t)&local_e8;
            QVar23.field_0.m_data_utf8 = (char *)&local_88;
            QSettings::value(QVar23,(QVariant *)local_1b8[0].m_data);
            sVar7 = ::QVariant::toInt((bool *)&local_88);
            sStack_4c = sVar7;
            ::QVariant::~QVariant((QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)&local_a8);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_178.a = &local_128;
            local_178.b.m_size = (qsizetype)&DAT_00000008;
            local_178.b.m_data = "/MaxSize";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      ((QAnyStringView *)local_1c8,&local_178,&local_1a8);
            ::QVariant::QVariant((QVariant *)&local_a8,iVar9);
            QVar24.m_size = (size_t)&local_e8;
            QVar24.field_0.m_data_utf8 = (char *)&local_88;
            QSettings::value(QVar24,(QVariant *)local_1c8[0].m_data);
            sVar7 = ::QVariant::toInt((bool *)&local_88);
            stack0xffffffffffffffb0 = CONCAT22(sVar7,local_68._24_2_);
            ::QVariant::~QVariant((QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)&local_a8);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_178.a = &local_128;
            local_178.b.m_size = (qsizetype)&DAT_00000006;
            local_178.b.m_data = "/Scale";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      ((QAnyStringView *)local_1d8,&local_178,&local_1a8);
            ::QVariant::QVariant((QVariant *)&local_a8,1);
            QVar25.m_size = (size_t)&local_e8;
            QVar25.field_0.m_data_utf8 = (char *)&local_88;
            QSettings::value(QVar25,(QVariant *)local_1d8[0].m_data);
            uVar8 = ::QVariant::toInt((bool *)&local_88);
            uStack_48 = (QString *)CONCAT62(uStack_48._2_6_,uVar8);
            ::QVariant::~QVariant((QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)&local_a8);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
            local_178.a = &local_128;
            local_178.b.m_size = (qsizetype)&DAT_00000008;
            local_178.b.m_data = "/Context";
            local_1a8.d.d = (Data *)0x0;
            local_1a8.d.ptr = (char16_t *)0x0;
            local_1a8.d.size = 0;
            QAnyStringView::QAnyStringView<QStringBuilder<QString_&,_QLatin1String>,_true>
                      (&local_1e8,&local_178,&local_1a8);
            QVar26.m_size = (size_t)&local_e8;
            QVar26.field_0.m_data = &local_88;
            QSettings::value(QVar26);
            ::QVariant::toString();
            ::QVariant::~QVariant((QVariant *)&local_88);
            if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,2,0x10);
              }
            }
            pDVar2 = local_a8.d;
            if (&(local_a8.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if ((undefined1 *)local_a8.size == (undefined1 *)0x9) {
              QVar28.m_data = (storage_type_conflict *)local_a8.ptr;
              QVar28.m_size = 9;
              QVar33.m_data = "MimeTypes";
              QVar33.m_size = 9;
              cVar4 = QtPrivate::equalStrings(QVar28,QVar33);
              CVar6 = cVar4 * '\x02';
            }
            else {
              if ((undefined1 *)local_a8.size == &DAT_0000000c) {
                QVar27.m_data = (storage_type_conflict *)local_a8.ptr;
                QVar27.m_size = 0xc;
                QVar32.m_data = "Applications";
                QVar32.m_size = 0xc;
                cVar4 = QtPrivate::equalStrings(QVar27,QVar32);
                CVar6 = Applications;
                if (cVar4 != '\0') goto LAB_0027938f;
              }
              CVar6 = UnknownContext;
            }
LAB_0027938f:
            uStack_48._0_4_ = CONCAT13(CVar6,(undefined3)uStack_48);
            if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
              }
            }
            QtPrivate::QMovableArrayOps<QIconDirInfo>::emplace<QIconDirInfo_const&>
                      ((QMovableArrayOps<QIconDirInfo> *)&this->m_keyList,(this->m_keyList).d.size,
                       (QIconDirInfo *)local_68);
            QList<QIconDirInfo>::end(&this->m_keyList);
            if (&(local_a8.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_a8.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_148.stream != (Stream *)0x0) {
              LOCK();
              *(int *)local_148.stream = *(int *)local_148.stream + -1;
              UNLOCK();
              if (*(int *)local_148.stream == 0) {
                QArrayData::deallocate((QArrayData *)local_148.stream,2,0x10);
              }
            }
            piVar1 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10)
                ;
              }
            }
            local_68._0_8_ = (QIconCacheGtkReader *)CONCAT44(local_68._4_4_,local_68._0_4_);
            if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              local_68._0_8_ = (QIconCacheGtkReader *)CONCAT44(local_68._4_4_,local_68._0_4_);
              if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
        pQVar13 = pQVar13 + 1;
        lVar12 = lVar12 + -0x18;
      } while (lVar12 != 0);
    }
    QVar29.m_size = (size_t)&local_e8;
    QVar29.field_0.m_data = local_68;
    QSettings::value(QVar29);
    ::QVariant::toStringList();
    qVar3 = local_a8.size;
    pQVar13 = local_a8.ptr;
    pDVar2 = local_a8.d;
    local_a8.size = 0;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (QString *)0x0;
    local_88.d = (this->m_parents).d.d;
    local_88.ptr = (this->m_parents).d.ptr;
    (this->m_parents).d.d = pDVar2;
    (this->m_parents).d.ptr = pQVar13;
    local_88.size = (this->m_parents).d.size;
    (this->m_parents).d.size = qVar3;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
    ::QVariant::~QVariant((QVariant *)local_68);
    local_68._16_4_ = 0;
    local_68._20_4_ = 0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    local_68._8_4_ = 0;
    local_68._12_4_ = 0;
    QtPrivate::sequential_erase_with_copy<QList<QString>,QString>
              (&this->m_parents,(QString *)local_68);
    piVar1 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_108);
    QSettings::~QSettings((QSettings *)&local_e8);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  QFile::~QFile((QFile *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QIconTheme::QIconTheme(const QString &themeName)
        : m_valid(false)
{
    QFile themeIndex;

    const QStringList iconDirs = QIcon::themeSearchPaths();
    for ( int i = 0 ; i < iconDirs.size() ; ++i) {
        QDir iconDir(iconDirs[i]);
        QString themeDir = iconDir.path() + u'/' + themeName;
        QFileInfo themeDirInfo(themeDir);

        if (themeDirInfo.isDir()) {
            m_contentDirs << themeDir;
            m_gtkCaches << QSharedPointer<QIconCacheGtkReader>::create(themeDir);
        }

        if (!m_valid) {
            themeIndex.setFileName(themeDir + "/index.theme"_L1);
            m_valid = themeIndex.exists();
            qCDebug(lcIconLoader) << "Probing theme file at" << themeIndex.fileName() << m_valid;
        }
    }
#if QT_CONFIG(settings)
    if (m_valid) {
        const QSettings indexReader(themeIndex.fileName(), QSettings::IniFormat);
        const QStringList keys = indexReader.allKeys();
        for (const QString &key : keys) {
            if (key.endsWith("/Size"_L1)) {
                // Note the QSettings ini-format does not accept
                // slashes in key names, hence we have to cheat
                if (int size = indexReader.value(key).toInt()) {
                    QString directoryKey = key.left(key.size() - 5);
                    QIconDirInfo dirInfo(directoryKey);
                    dirInfo.size = size;
                    QString type = indexReader.value(directoryKey + "/Type"_L1).toString();

                    if (type == "Fixed"_L1)
                        dirInfo.type = QIconDirInfo::Fixed;
                    else if (type == "Scalable"_L1)
                        dirInfo.type = QIconDirInfo::Scalable;
                    else
                        dirInfo.type = QIconDirInfo::Threshold;

                    dirInfo.threshold = indexReader.value(directoryKey +
                                                          "/Threshold"_L1,
                                                          2).toInt();

                    dirInfo.minSize = indexReader.value(directoryKey + "/MinSize"_L1, size).toInt();

                    dirInfo.maxSize = indexReader.value(directoryKey + "/MaxSize"_L1, size).toInt();

                    dirInfo.scale = indexReader.value(directoryKey + "/Scale"_L1, 1).toInt();

                    const QString context = indexReader.value(directoryKey + "/Context"_L1).toString();
                    dirInfo.context = [context]() {
                        if (context == "Applications"_L1)
                            return QIconDirInfo::Applications;
                        else if (context == "MimeTypes"_L1)
                            return QIconDirInfo::MimeTypes;
                        else
                            return QIconDirInfo::UnknownContext;
                    }();

                    m_keyList.append(dirInfo);
                }
            }
        }

        // Parent themes provide fallbacks for missing icons
        m_parents = indexReader.value("Icon Theme/Inherits"_L1).toStringList();
        m_parents.removeAll(QString());
    }
#endif // settings
}